

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

shared_ptr<tf::TFProfObserver> __thiscall
tf::Executor::make_observer<tf::TFProfObserver>(Executor *this)

{
  element_type *this_00;
  size_type num_workers;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tf::TFProfObserver> sVar1;
  shared_ptr<tf::ObserverInterface> local_40 [2];
  undefined1 local_19;
  Executor *this_local;
  shared_ptr<tf::TFProfObserver> *ptr;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<tf::TFProfObserver>();
  this_00 = std::__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  num_workers = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::size
                          ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)(in_RSI + 0xe8));
  TFProfObserver::set_up(this_00,num_workers);
  std::static_pointer_cast<tf::ObserverInterface,tf::TFProfObserver>
            ((shared_ptr<tf::TFProfObserver> *)local_40);
  std::
  unordered_set<std::shared_ptr<tf::ObserverInterface>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::allocator<std::shared_ptr<tf::ObserverInterface>>>
  ::emplace<std::shared_ptr<tf::ObserverInterface>>
            ((unordered_set<std::shared_ptr<tf::ObserverInterface>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::allocator<std::shared_ptr<tf::ObserverInterface>>>
              *)(in_RSI + 0x298),local_40);
  std::shared_ptr<tf::ObserverInterface>::~shared_ptr(local_40);
  sVar1.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tf::TFProfObserver>)
         sVar1.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Observer> Executor::make_observer(ArgsT&&... args) {

  static_assert(
    std::is_base_of_v<ObserverInterface, Observer>,
    "Observer must be derived from ObserverInterface"
  );

  // use a local variable to mimic the constructor
  auto ptr = std::make_shared<Observer>(std::forward<ArgsT>(args)...);

  ptr->set_up(_workers.size());

  _observers.emplace(std::static_pointer_cast<ObserverInterface>(ptr));

  return ptr;
}